

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_trace_file.c
# Opt level: O0

mFILE * find_file_url(char *file,char *url)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  size_t sVar4;
  hFILE *fp;
  mFILE *mf_00;
  ssize_t sVar5;
  size_t sVar6;
  hFILE *hf;
  int len;
  int maxlen;
  mFILE *mf;
  char *cp;
  char buf [8192];
  char *local_20;
  char *url_local;
  char *file_local;
  
  sVar3 = strlen(file);
  mf = (mFILE *)&cp;
  local_20 = url;
  while( true ) {
    bVar1 = false;
    if (*local_20 != '\0') {
      bVar1 = (long)mf - (long)&cp < (long)(0x1ffe - (int)sVar3);
    }
    if (!bVar1) break;
    if ((*local_20 == '%') && (local_20[1] == 's')) {
      local_20 = local_20 + 1;
      __s = strcpy((char *)mf,file);
      sVar4 = strlen(__s);
      mf = (mFILE *)((long)&mf->fp + sVar4);
    }
    else {
      *(char *)&mf->fp = *local_20;
      mf = (mFILE *)((long)&mf->fp + 1);
    }
    local_20 = local_20 + 1;
  }
  *(undefined1 *)&mf->fp = 0;
  fp = hopen((char *)&cp,"r");
  if ((fp != (hFILE *)0x0) && (mf_00 = mfcreate((char *)0x0,0), mf_00 != (mFILE *)0x0)) {
    do {
      sVar5 = hread(fp,&cp,0x2000);
      if ((int)sVar5 < 1) {
        iVar2 = hclose(fp);
        if (-1 < iVar2) {
          mrewind(mf_00);
          return mf_00;
        }
        mfdestroy(mf_00);
        return (mFILE *)0x0;
      }
      sVar6 = mfwrite(&cp,(long)(int)sVar5,1,mf_00);
    } while (sVar6 != 0);
    hclose_abruptly(fp);
    mfdestroy(mf_00);
  }
  return (mFILE *)0x0;
}

Assistant:

mFILE *find_file_url(char *file, char *url) {
    char buf[8192], *cp;
    mFILE *mf = NULL;
    int maxlen = 8190 - strlen(file), len;
    hFILE *hf;

    /* Expand %s for the trace name */
    for (cp = buf; *url && cp - buf < maxlen; url++) {
	if (*url == '%' && *(url+1) == 's') {
	    url++;
	    cp += strlen(strcpy(cp, file));
	} else {
	    *cp++ = *url;
	}
    }
    *cp++ = 0;

    if (!(hf = hopen(buf, "r")))
	return NULL;

    if (NULL == (mf = mfcreate(NULL, 0)))
	return NULL;
    while ((len = hread(hf, buf, 8192)) > 0) {
	if (mfwrite(buf, len, 1, mf) <= 0) {
	    hclose_abruptly(hf);
	    mfdestroy(mf);
	    return NULL;
	}
    }
    if (hclose(hf) < 0) {
	mfdestroy(mf);
	return NULL;
    }

    mrewind(mf);
    return mf;
}